

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O3

void __thiscall Subscriber::~Subscriber(Subscriber *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Subscriber = (_func_int **)&PTR_on_error_00139c68;
  if (-1 < this->fd) {
    close(this->fd);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Subscriber::~Subscriber() {
  if (this->fd >= 0) {
    close(this->fd);
  }
}